

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(value_type *__return_storage_ptr__,
            FadBinaryMul<Fad<Fad<double>_>,_FadExpr<FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>
            *this,int i)

{
  Fad<Fad<double>_> *pFVar1;
  uint uVar2;
  double *pdVar3;
  Fad<double> *pFVar4;
  int i_1;
  ulong uVar5;
  value_type vVar6;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_98;
  FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
  local_88;
  value_type local_78;
  value_type local_58;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_38;
  
  pFVar4 = (this->left_->dx_).ptr_to_data + i;
  FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::val(&local_58,&this->right_->fadexpr_);
  local_98.fadexpr_.left_ = pFVar4;
  local_98.fadexpr_.right_ = &local_58;
  FadBinaryDiv<Fad<Fad<double>_>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_78,&this->right_->fadexpr_,i);
  pFVar1 = this->left_;
  local_38.fadexpr_.right_ = &pFVar1->val_;
  local_88.right_ = &local_38;
  __return_storage_ptr__->val_ = local_78.val_ * (pFVar1->val_).val_ + pFVar4->val_ * local_58.val_;
  uVar2 = (pFVar4->dx_).num_elts;
  if (local_58.dx_.num_elts < (int)uVar2) {
    local_58.dx_.num_elts = uVar2;
  }
  uVar2 = (pFVar1->val_).dx_.num_elts;
  if ((int)uVar2 < local_78.dx_.num_elts) {
    uVar2 = local_78.dx_.num_elts;
  }
  if ((int)uVar2 < local_58.dx_.num_elts) {
    uVar2 = local_58.dx_.num_elts;
  }
  (__return_storage_ptr__->dx_).num_elts = 0;
  (__return_storage_ptr__->dx_).ptr_to_data = (double *)0x0;
  local_38.fadexpr_.left_ = &local_78;
  if ((int)uVar2 < 1) {
    __return_storage_ptr__->defaultVal = 0.0;
    local_88.left_ = &local_98;
  }
  else {
    (__return_storage_ptr__->dx_).num_elts = uVar2;
    local_88.left_ = &local_98;
    pdVar3 = (double *)operator_new__((ulong)uVar2 * 8);
    (__return_storage_ptr__->dx_).ptr_to_data = pdVar3;
    __return_storage_ptr__->defaultVal = 0.0;
    uVar5 = 0;
    do {
      vVar6 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
              ::dx(&local_88,(int)uVar5);
      pdVar3[uVar5] = vVar6;
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  Fad<double>::~Fad(&local_78);
  Fad<double>::~Fad(&local_58);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}